

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

void __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::
SyncToLiteralAndConsumeInstT
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,InstTag tag,
          CharCount offset,CharCount length)

{
  CharCount length_local;
  CharCount offset_local;
  InstTag tag_local;
  SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this_local;
  
  Inst::Inst(&this->super_Inst,tag);
  EquivScannerMixinT<1U>::EquivScannerMixinT(&this->super_EquivScannerMixinT<1U>,offset,length);
  return;
}

Assistant:

SyncToLiteralAndConsumeInstT(InstTag tag, CharCount offset, CharCount length) : Inst(tag), ScannerT(offset, length) {}